

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O3

void mergesort_2way_register_hook(void)

{
  routine_register(&mergesort_2way_routine);
  return;
}

Assistant:

static void
mergesort_2way_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/2;
#pragma omp parallel sections
	{
#pragma omp section
		mergesort_2way_parallel(strings,        split0,   tmp);
#pragma omp section
		mergesort_2way_parallel(strings+split0, n-split0, tmp+split0);
	}
	merge_2way(strings, split0,
	           strings+split0, n-split0,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}